

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,string_view symbol)

{
  byte bVar1;
  pointer pSVar2;
  _Alloc_hider _Var3;
  DescriptorIndex *pDVar4;
  DescriptorIndex *pDVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  reference pSVar9;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var10;
  LogMessage *pLVar11;
  char *pcVar12;
  size_t sVar13;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_00;
  SymbolEntry *this_01;
  const_iterator other;
  string_view str;
  string_view v;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view v_00;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view v_01;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view v_02;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  const_iterator cVar14;
  iterator iVar15;
  string_view sub_symbol;
  string_view sub_symbol_00;
  string_view sub_symbol_01;
  string_view sub_symbol_02;
  string_view super_symbol;
  string_view super_symbol_00;
  string_view super_symbol_01;
  string_view super_symbol_02;
  string entry_as_string;
  SymbolEntry entry;
  string local_d8;
  LogMessage local_b8;
  DescriptorIndex *local_a8;
  DescriptorIndex *local_a0;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  local_98;
  DescriptorIndex *local_88;
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar12 = symbol._M_str;
  sVar13 = symbol._M_len;
  local_58._0_4_ =
       (int)((ulong)((long)(this->all_values_).
                           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->all_values_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar12,pcVar12 + sVar13);
  SymbolEntry::AsString_abi_cxx11_((string *)local_78,(SymbolEntry *)local_58,this);
  if (sVar13 != 0) {
    sVar8 = 0;
    do {
      bVar1 = pcVar12[sVar8];
      if ((((bVar1 != 0x2e) && (bVar1 != 0x5f)) && ((byte)(bVar1 - 0x3a) < 0xf6)) &&
         ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2e4);
        str_11._M_str = "Invalid symbol name: ";
        str_11._M_len = 0x15;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_d8,str_11);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_d8,(string *)local_78);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_d8);
        goto LAB_001b4ac1;
      }
      sVar8 = sVar8 + 1;
    } while (sVar13 != sVar8);
  }
  local_80 = (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              *)&this->by_symbol_;
  cVar14 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
           ::upper_bound<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                     (local_80,(SymbolEntry *)local_58);
  local_d8._M_dataplus._M_p = (pointer)cVar14.node_;
  local_d8._M_string_length._0_4_ = cVar14.position_;
  cVar14 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
           ::begin(local_80);
  bVar7 = absl::lts_20250127::container_internal::
          btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
          ::Equals((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                    *)&local_d8,cVar14);
  if (!bVar7) {
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
    ::decrement((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 *)&local_d8);
  }
  uVar6 = local_78._0_8_;
  local_98.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
        *)local_d8._M_dataplus._M_p;
  local_98.position_ = (int)local_d8._M_string_length;
  local_a8 = (DescriptorIndex *)local_78._8_8_;
  iVar15 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
           ::end(local_80);
  bVar7 = absl::lts_20250127::container_internal::
          btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
          ::Equals(&local_98,(const_iterator)iVar15);
  if (bVar7) {
LAB_001b46a3:
    _Var10 = std::
             __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                       ((this->by_symbol_flat_).
                        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->by_symbol_flat_).
                        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(SymbolEntry *)local_58,
                        (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                         )(this->by_symbol_).
                          super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                          .
                          super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                          .tree_.rightmost_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_0UL,_false>
                          .value.
                          super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_true>
                          .super_SymbolCompare.index);
    uVar6 = local_78._0_8_;
    this_00._M_current = _Var10._M_current + -1;
    if (_Var10._M_current ==
        (this->by_symbol_flat_).
        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = _Var10;
    }
    pSVar2 = (this->by_symbol_flat_).
             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00._M_current != pSVar2) {
      SymbolEntry::AsString_abi_cxx11_(&local_d8,this_00._M_current,this);
      _Var3._M_p = local_d8._M_dataplus._M_p;
      sub_symbol_01._M_len._4_4_ = local_d8._M_string_length._4_4_;
      sub_symbol_01._M_len._0_4_ = (int)local_d8._M_string_length;
      local_88 = (DescriptorIndex *)local_78._8_8_;
      local_a8 = (DescriptorIndex *)uVar6;
      sub_symbol_01._M_str = local_d8._M_dataplus._M_p;
      super_symbol_01._M_str = (char *)uVar6;
      super_symbol_01._M_len = local_78._8_8_;
      local_a0 = this;
      bVar7 = anon_unknown_23::IsSubSymbol(sub_symbol_01,super_symbol_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_d8.field_2) {
        operator_delete(_Var3._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pDVar5 = local_a0;
      pDVar4 = local_a8;
      if (bVar7) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2c1);
        pDVar5 = local_a0;
        pDVar4 = local_a8;
        str._M_str = "Symbol name \"";
        str._M_len = 0xd;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_b8,str);
        v._M_str = (char *)pDVar4;
        v._M_len = (size_t)local_88;
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_b8,v);
        str_00._M_str = "\" conflicts with the existing symbol \"";
        str_00._M_len = 0x26;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar11,str_00);
        SymbolEntry::AsString_abi_cxx11_(&local_d8,this_00._M_current,pDVar5);
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,&local_d8);
        str_01._M_str = "\".";
        str_01._M_len = 2;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar11,str_01);
        AddSymbol();
        goto LAB_001b4ac1;
      }
      this_01 = this_00._M_current + 1;
      if (this_01 != pSVar2) {
        SymbolEntry::AsString_abi_cxx11_(&local_d8,this_01,local_a0);
        _Var3._M_p = local_d8._M_dataplus._M_p;
        super_symbol_02._M_len._4_4_ = local_d8._M_string_length._4_4_;
        super_symbol_02._M_len._0_4_ = (int)local_d8._M_string_length;
        sub_symbol_02._M_str = (char *)pDVar4;
        sub_symbol_02._M_len = (size_t)local_88;
        super_symbol_02._M_str = local_d8._M_dataplus._M_p;
        bVar7 = anon_unknown_23::IsSubSymbol(sub_symbol_02,super_symbol_02);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_d8.field_2) {
          operator_delete(_Var3._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        pDVar4 = local_a8;
        if (bVar7) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2cf);
          str_05._M_str = "Symbol name \"";
          str_05._M_len = 0xd;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_b8,str_05);
          v_01._M_str = (char *)pDVar4;
          v_01._M_len = (size_t)local_88;
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_b8,v_01);
          str_06._M_str = "\" conflicts with the existing symbol \"";
          str_06._M_len = 0x26;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar11,str_06);
          SymbolEntry::AsString_abi_cxx11_(&local_d8,this_01,pDVar5);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,&local_d8);
          str_07._M_str = "\".";
          str_07._M_len = 2;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar11,str_07);
          AddSymbol();
          goto LAB_001b4ac1;
        }
      }
    }
    iVar15.position_ = local_98.position_;
    iVar15.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                    *)local_98.node_;
    iVar15._12_4_ = 0;
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
    ::
    insert_hint_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
              ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>,_bool>
                *)&local_d8,
               (btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
                *)local_80,iVar15,(SymbolEntry *)local_58,(SymbolEntry *)local_58);
    bVar7 = true;
  }
  else {
    pSVar9 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
             ::operator*(&local_98);
    SymbolEntry::AsString_abi_cxx11_(&local_d8,pSVar9,this);
    _Var3._M_p = local_d8._M_dataplus._M_p;
    sub_symbol._M_len._4_4_ = local_d8._M_string_length._4_4_;
    sub_symbol._M_len._0_4_ = (int)local_d8._M_string_length;
    local_a0 = (DescriptorIndex *)uVar6;
    sub_symbol._M_str = local_d8._M_dataplus._M_p;
    super_symbol._M_str = (char *)uVar6;
    super_symbol._M_len = (size_t)local_a8;
    bVar7 = anon_unknown_23::IsSubSymbol(sub_symbol,super_symbol);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_d8.field_2) {
      operator_delete(_Var3._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar7) {
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
      ::increment(&local_98);
      pDVar4 = local_a0;
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                     *)SUB128(iVar15._0_12_,0);
      other.position_ = SUB124(iVar15._0_12_,8);
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
              ::Equals(&local_98,other);
      if (!bVar7) {
        pSVar9 = absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                 ::operator*(&local_98);
        SymbolEntry::AsString_abi_cxx11_(&local_d8,pSVar9,this);
        _Var3._M_p = local_d8._M_dataplus._M_p;
        super_symbol_00._M_len._4_4_ = local_d8._M_string_length._4_4_;
        super_symbol_00._M_len._0_4_ = (int)local_d8._M_string_length;
        sub_symbol_00._M_str = (char *)pDVar4;
        sub_symbol_00._M_len = (size_t)local_a8;
        super_symbol_00._M_str = local_d8._M_dataplus._M_p;
        bVar7 = anon_unknown_23::IsSubSymbol(sub_symbol_00,super_symbol_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_d8.field_2) {
          operator_delete(_Var3._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2cf);
          str_08._M_str = "Symbol name \"";
          str_08._M_len = 0xd;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (&local_b8,str_08);
          v_02._M_str = (char *)pDVar4;
          v_02._M_len = (size_t)local_a8;
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_b8,v_02);
          str_09._M_str = "\" conflicts with the existing symbol \"";
          str_09._M_len = 0x26;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar11,str_09);
          pSVar9 = absl::lts_20250127::container_internal::
                   btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                   ::operator*(&local_98);
          SymbolEntry::AsString_abi_cxx11_(&local_d8,pSVar9,this);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,&local_d8);
          str_10._M_str = "\".";
          str_10._M_len = 2;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    (pLVar11,str_10);
          AddSymbol();
          goto LAB_001b4ac1;
        }
      }
      goto LAB_001b46a3;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2c1);
    pDVar4 = local_a0;
    str_02._M_str = "Symbol name \"";
    str_02._M_len = 0xd;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_b8,str_02);
    v_00._M_str = (char *)pDVar4;
    v_00._M_len = (size_t)local_a8;
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_b8,v_00);
    str_03._M_str = "\" conflicts with the existing symbol \"";
    str_03._M_len = 0x26;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar11,str_03)
    ;
    pSVar9 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
             ::operator*(&local_98);
    SymbolEntry::AsString_abi_cxx11_(&local_d8,pSVar9,this);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar11,&local_d8);
    str_04._M_str = "\".";
    str_04._M_len = 2;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar11,str_04)
    ;
    AddSymbol();
LAB_001b4ac1:
    bVar7 = false;
  }
  if ((DescriptorIndex *)local_78._0_8_ != (DescriptorIndex *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    absl::string_view symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    ABSL_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}